

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_4ebe96::BNTest_ASC2BN_Test::TestBody(BNTest_ASC2BN_Test *this)

{
  _Head_base<0UL,_bignum_st_*,_false> _Var1;
  int iVar2;
  pointer __p;
  _Alloc_hider _Var3;
  pointer *__ptr;
  char *in_R9;
  pointer *__ptr_1;
  bool bVar4;
  internal iVar5;
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> bn;
  BIGNUM *raw;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  AssertHelper local_50;
  _Head_base<0UL,_bignum_st_*,_false> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _Head_base<0UL,_bignum_st_*,_false> local_38;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)0x0;
  iVar2 = BN_asc2bn((BIGNUM **)&local_30,"0");
  local_38._M_head_impl = (bignum_st *)local_30._M_dataplus._M_p;
  if (iVar2 == 0) {
    local_38._M_head_impl = (bignum_st *)(BIGNUM *)0x0;
  }
  iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_48._M_head_impl._0_1_ = iVar5;
  if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
    testing::Message::Message((Message *)&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x4ba,local_30._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
  }
  else {
    iVar2 = BN_is_zero(local_38._M_head_impl);
    local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_48,(AssertionResult *)"BN_is_zero(bn.get())","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bb,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    iVar2 = BN_is_negative(local_38._M_head_impl);
    local_48._M_head_impl._0_1_ = (internal)(iVar2 == 0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 != 0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bc,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_58._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))();
      }
    }
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    local_30._M_dataplus._M_p = (pointer)0x0;
    iVar2 = BN_asc2bn((BIGNUM **)&local_30,"256");
    _Var1._M_head_impl = local_38._M_head_impl;
    _Var3._M_p = local_30._M_dataplus._M_p;
    if (iVar2 == 0) {
      _Var3._M_p = (pointer)(BIGNUM *)0x0;
    }
    local_48._M_head_impl = (bignum_st *)0x0;
    bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
    local_38._M_head_impl = (bignum_st *)_Var3._M_p;
    if (bVar4) {
      BN_free((BIGNUM *)_Var1._M_head_impl);
    }
    std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
    iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
    local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48._M_head_impl._0_1_ = iVar5;
    if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
      testing::Message::Message((Message *)&local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x4bf,local_30._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    }
    else {
      iVar2 = BN_is_word(local_38._M_head_impl,0x100);
      local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)&local_48,(AssertionResult *)"BN_is_word(bn.get(), 256)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c0,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      iVar2 = BN_is_negative(local_38._M_head_impl);
      local_48._M_head_impl._0_1_ = (internal)(iVar2 == 0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar2 != 0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true","false",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c1,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != &local_30.field_2) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
        if (local_58._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_58._M_head_impl + 8))();
        }
      }
      if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,local_40);
      }
      local_30._M_dataplus._M_p = (pointer)0x0;
      iVar2 = BN_asc2bn((BIGNUM **)&local_30,"-42");
      _Var1._M_head_impl = local_38._M_head_impl;
      _Var3._M_p = local_30._M_dataplus._M_p;
      if (iVar2 == 0) {
        _Var3._M_p = (pointer)(BIGNUM *)0x0;
      }
      local_48._M_head_impl = (bignum_st *)0x0;
      bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
      local_38._M_head_impl = (bignum_st *)_Var3._M_p;
      if (bVar4) {
        BN_free((BIGNUM *)_Var1._M_head_impl);
      }
      std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
      iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
      local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_48._M_head_impl._0_1_ = iVar5;
      if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
        testing::Message::Message((Message *)&local_58);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",in_R9)
        ;
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x4c4,local_30._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
      }
      else {
        iVar2 = BN_abs_is_word(local_38._M_head_impl,0x2a);
        local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)&local_48,
                     (AssertionResult *)"BN_abs_is_word(bn.get(), 42)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c5,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != &local_30.field_2) {
            operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
          }
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        iVar2 = BN_is_negative(local_38._M_head_impl);
        local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c6,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_30._M_dataplus._M_p != &local_30.field_2) {
            operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
          }
          if (local_58._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_58._M_head_impl + 8))();
          }
        }
        if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_40,local_40);
        }
        local_30._M_dataplus._M_p = (pointer)0x0;
        iVar2 = BN_asc2bn((BIGNUM **)&local_30,"0x1234");
        _Var1._M_head_impl = local_38._M_head_impl;
        _Var3._M_p = local_30._M_dataplus._M_p;
        if (iVar2 == 0) {
          _Var3._M_p = (pointer)(BIGNUM *)0x0;
        }
        local_48._M_head_impl = (bignum_st *)0x0;
        bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
        local_38._M_head_impl = (bignum_st *)_Var3._M_p;
        if (bVar4) {
          BN_free((BIGNUM *)_Var1._M_head_impl);
        }
        std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
        iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
        local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_48._M_head_impl._0_1_ = iVar5;
        if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
          testing::Message::Message((Message *)&local_58);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_50,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x4c9,local_30._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
        }
        else {
          iVar2 = BN_is_word(local_38._M_head_impl,0x1234);
          local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 == 0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,(internal *)&local_48,
                       (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ca,local_30._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_30._M_dataplus._M_p != &local_30.field_2) {
              operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
            }
            if (local_58._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_58._M_head_impl + 8))();
            }
          }
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
          iVar2 = BN_is_negative(local_38._M_head_impl);
          local_48._M_head_impl._0_1_ = (internal)(iVar2 == 0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (iVar2 != 0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true","false",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4cb,local_30._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
            testing::internal::AssertHelper::~AssertHelper(&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_30._M_dataplus._M_p != &local_30.field_2) {
              operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
            }
            if (local_58._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_58._M_head_impl + 8))();
            }
          }
          if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_40,local_40);
          }
          local_30._M_dataplus._M_p = (pointer)0x0;
          iVar2 = BN_asc2bn((BIGNUM **)&local_30,"0X1234");
          _Var1._M_head_impl = local_38._M_head_impl;
          _Var3._M_p = local_30._M_dataplus._M_p;
          if (iVar2 == 0) {
            _Var3._M_p = (pointer)(BIGNUM *)0x0;
          }
          local_48._M_head_impl = (bignum_st *)0x0;
          bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
          local_38._M_head_impl = (bignum_st *)_Var3._M_p;
          if (bVar4) {
            BN_free((BIGNUM *)_Var1._M_head_impl);
          }
          std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
          iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
          local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          local_48._M_head_impl._0_1_ = iVar5;
          if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
            testing::Message::Message((Message *)&local_58);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",
                       in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_50,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x4ce,local_30._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
          }
          else {
            iVar2 = BN_is_word(local_38._M_head_impl,0x1234);
            local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 == 0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_30,(internal *)&local_48,
                         (AssertionResult *)"BN_is_word(bn.get(), 0x1234)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4cf,local_30._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_30._M_dataplus._M_p != &local_30.field_2) {
                operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_58._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_58._M_head_impl + 8))();
              }
            }
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
            iVar2 = BN_is_negative(local_38._M_head_impl);
            local_48._M_head_impl._0_1_ = (internal)(iVar2 == 0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (iVar2 != 0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true","false",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d0,local_30._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
              testing::internal::AssertHelper::~AssertHelper(&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_30._M_dataplus._M_p != &local_30.field_2) {
                operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_58._M_head_impl !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                (**(code **)(*(long *)local_58._M_head_impl + 8))();
              }
            }
            if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,local_40);
            }
            local_30._M_dataplus._M_p = (pointer)0x0;
            iVar2 = BN_asc2bn((BIGNUM **)&local_30,"-0xabcd");
            _Var1._M_head_impl = local_38._M_head_impl;
            _Var3._M_p = local_30._M_dataplus._M_p;
            if (iVar2 == 0) {
              _Var3._M_p = (pointer)(BIGNUM *)0x0;
            }
            local_48._M_head_impl = (bignum_st *)0x0;
            bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
            local_38._M_head_impl = (bignum_st *)_Var3._M_p;
            if (bVar4) {
              BN_free((BIGNUM *)_Var1._M_head_impl);
            }
            std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
            iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
            local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            local_48._M_head_impl._0_1_ = iVar5;
            if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
              testing::Message::Message((Message *)&local_58);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false","true",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_50,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                         ,0x4d3,local_30._M_dataplus._M_p);
              testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
            }
            else {
              iVar2 = BN_abs_is_word(local_38._M_head_impl,0xabcd);
              local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_30,(internal *)&local_48,
                           (AssertionResult *)"BN_abs_is_word(bn.get(), 0xabcd)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d4,local_30._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_30._M_dataplus._M_p != &local_30.field_2) {
                  operator_delete(local_30._M_dataplus._M_p,
                                  local_30.field_2._M_allocated_capacity + 1);
                }
                if (local_58._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_58._M_head_impl + 8))();
                }
              }
              if (local_40 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_40,local_40);
              }
              iVar2 = BN_is_negative(local_38._M_head_impl);
              local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (iVar2 == 0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_30,(internal *)&local_48,
                           (AssertionResult *)"!BN_is_negative(bn.get())","true","false",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d5,local_30._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                testing::internal::AssertHelper::~AssertHelper(&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_30._M_dataplus._M_p != &local_30.field_2) {
                  operator_delete(local_30._M_dataplus._M_p,
                                  local_30.field_2._M_allocated_capacity + 1);
                }
                if (local_58._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                {
                  (**(code **)(*(long *)local_58._M_head_impl + 8))();
                }
              }
              if (local_40 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_40,local_40);
              }
              local_30._M_dataplus._M_p = (pointer)0x0;
              iVar2 = BN_asc2bn((BIGNUM **)&local_30,"-0");
              _Var1._M_head_impl = local_38._M_head_impl;
              _Var3._M_p = local_30._M_dataplus._M_p;
              if (iVar2 == 0) {
                _Var3._M_p = (pointer)(BIGNUM *)0x0;
              }
              local_48._M_head_impl = (bignum_st *)0x0;
              bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
              local_38._M_head_impl = (bignum_st *)_Var3._M_p;
              if (bVar4) {
                BN_free((BIGNUM *)_Var1._M_head_impl);
              }
              std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                        ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
              iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
              local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_48._M_head_impl._0_1_ = iVar5;
              if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
                testing::Message::Message((Message *)&local_58);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false",
                           "true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_50,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                           ,0x4d8,local_30._M_dataplus._M_p);
                testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
              }
              else {
                iVar2 = BN_is_zero(local_38._M_head_impl);
                local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 == 0) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,(internal *)&local_48,
                             (AssertionResult *)"BN_is_zero(bn.get())","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4d9,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_30._M_dataplus._M_p != &local_30.field_2) {
                    operator_delete(local_30._M_dataplus._M_p,
                                    local_30.field_2._M_allocated_capacity + 1);
                  }
                  if (local_58._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_58._M_head_impl + 8))();
                  }
                }
                if (local_40 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_40,local_40);
                }
                iVar2 = BN_is_negative(local_38._M_head_impl);
                local_48._M_head_impl._0_1_ = (internal)(iVar2 == 0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                if (iVar2 != 0) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4da,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                  testing::internal::AssertHelper::~AssertHelper(&local_50);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_30._M_dataplus._M_p != &local_30.field_2) {
                    operator_delete(local_30._M_dataplus._M_p,
                                    local_30.field_2._M_allocated_capacity + 1);
                  }
                  if (local_58._M_head_impl !=
                      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                     ) {
                    (**(code **)(*(long *)local_58._M_head_impl + 8))();
                  }
                }
                if (local_40 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_40,local_40);
                }
                local_30._M_dataplus._M_p = (pointer)0x0;
                iVar2 = BN_asc2bn((BIGNUM **)&local_30,"123trailing garbage is ignored");
                _Var1._M_head_impl = local_38._M_head_impl;
                _Var3._M_p = local_30._M_dataplus._M_p;
                if (iVar2 == 0) {
                  _Var3._M_p = (pointer)(BIGNUM *)0x0;
                }
                local_48._M_head_impl = (bignum_st *)0x0;
                bVar4 = (BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0;
                local_38._M_head_impl = (bignum_st *)_Var3._M_p;
                if (bVar4) {
                  BN_free((BIGNUM *)_Var1._M_head_impl);
                }
                std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_48);
                iVar5 = (internal)((BIGNUM *)local_38._M_head_impl != (BIGNUM *)0x0);
                local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_48._M_head_impl._0_1_ = iVar5;
                if ((BIGNUM *)local_38._M_head_impl == (BIGNUM *)0x0) {
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,(internal *)&local_48,(AssertionResult *)0x55e5dc,"false",
                             "true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4dd,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                }
                else {
                  iVar2 = BN_is_word(local_38._M_head_impl,0x7b);
                  local_48._M_head_impl._0_1_ = (internal)(iVar2 != 0);
                  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  if (iVar2 == 0) {
                    testing::Message::Message((Message *)&local_58);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              (&local_30,(internal *)&local_48,
                               (AssertionResult *)"BN_is_word(bn.get(), 123)","false","true",in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              (&local_50,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                               ,0x4de,local_30._M_dataplus._M_p);
                    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                    testing::internal::AssertHelper::~AssertHelper(&local_50);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_30._M_dataplus._M_p != &local_30.field_2) {
                      operator_delete(local_30._M_dataplus._M_p,
                                      local_30.field_2._M_allocated_capacity + 1);
                    }
                    if (local_58._M_head_impl !=
                        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x0) {
                      (**(code **)(*(long *)local_58._M_head_impl + 8))();
                    }
                  }
                  if (local_40 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_40,local_40);
                  }
                  iVar2 = BN_is_negative(local_38._M_head_impl);
                  iVar5 = (internal)(iVar2 == 0);
                  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x0;
                  local_48._M_head_impl._0_1_ = iVar5;
                  if ((bool)iVar5) goto LAB_002bcf10;
                  testing::Message::Message((Message *)&local_58);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_30,(internal *)&local_48,(AssertionResult *)0x55e4eb,"true",
                             "false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_50,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                             ,0x4df,local_30._M_dataplus._M_p);
                  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_58._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_58._M_head_impl + 8))();
  }
LAB_002bcf10:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST_F(BNTest, ASC2BN) {
  bssl::UniquePtr<BIGNUM> bn = ASCIIToBIGNUM("0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("256");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 256));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-42");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 42));
  EXPECT_TRUE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0x1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("0X1234");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 0x1234));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0xabcd");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_abs_is_word(bn.get(), 0xabcd));
  EXPECT_FALSE(!BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("-0");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_zero(bn.get()));
  EXPECT_FALSE(BN_is_negative(bn.get()));

  bn = ASCIIToBIGNUM("123trailing garbage is ignored");
  ASSERT_TRUE(bn);
  EXPECT_TRUE(BN_is_word(bn.get(), 123));
  EXPECT_FALSE(BN_is_negative(bn.get()));
}